

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.c
# Opt level: O0

size_t GetBufferReadRegions
                 (RingBuffer *buf,size_t element_count,void **data_ptr_1,size_t *data_ptr_bytes_1,
                 void **data_ptr_2,size_t *data_ptr_bytes_2)

{
  size_t sVar1;
  ulong uVar2;
  ulong local_58;
  size_t margin;
  size_t read_elements;
  size_t readable_elements;
  size_t *data_ptr_bytes_2_local;
  void **data_ptr_2_local;
  size_t *data_ptr_bytes_1_local;
  void **data_ptr_1_local;
  size_t element_count_local;
  RingBuffer *buf_local;
  
  sVar1 = WebRtc_available_read(buf);
  local_58 = element_count;
  if (sVar1 < element_count) {
    local_58 = sVar1;
  }
  uVar2 = buf->element_count - buf->read_pos;
  if (uVar2 < local_58) {
    *data_ptr_1 = buf->data + buf->read_pos * buf->element_size;
    *data_ptr_bytes_1 = uVar2 * buf->element_size;
    *data_ptr_2 = buf->data;
    *data_ptr_bytes_2 = (local_58 - uVar2) * buf->element_size;
  }
  else {
    *data_ptr_1 = buf->data + buf->read_pos * buf->element_size;
    *data_ptr_bytes_1 = local_58 * buf->element_size;
    *data_ptr_2 = (void *)0x0;
    *data_ptr_bytes_2 = 0;
  }
  return local_58;
}

Assistant:

static size_t GetBufferReadRegions(RingBuffer* buf,
                                   size_t element_count,
                                   void** data_ptr_1,
                                   size_t* data_ptr_bytes_1,
                                   void** data_ptr_2,
                                   size_t* data_ptr_bytes_2) {

  const size_t readable_elements = WebRtc_available_read(buf);
  const size_t read_elements = (readable_elements < element_count ?
      readable_elements : element_count);
  const size_t margin = buf->element_count - buf->read_pos;

  // Check to see if read is not contiguous.
  if (read_elements > margin) {
    // Write data in two blocks that wrap the buffer.
    *data_ptr_1 = buf->data + buf->read_pos * buf->element_size;
    *data_ptr_bytes_1 = margin * buf->element_size;
    *data_ptr_2 = buf->data;
    *data_ptr_bytes_2 = (read_elements - margin) * buf->element_size;
  } else {
    *data_ptr_1 = buf->data + buf->read_pos * buf->element_size;
    *data_ptr_bytes_1 = read_elements * buf->element_size;
    *data_ptr_2 = NULL;
    *data_ptr_bytes_2 = 0;
  }

  return read_elements;
}